

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTPNListBase::add_element(CTPNListBase *this,CTcPrsNode *expr)

{
  int iVar1;
  CTPNListEle *pCVar2;
  undefined4 extraout_var;
  CTPNListBase *pCVar3;
  
  pCVar2 = (CTPNListEle *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x20,(size_t)expr);
  (pCVar2->super_CTPNListEleBase).expr_ = expr;
  (pCVar2->super_CTPNListEleBase).next_ = (CTPNListEle *)0x0;
  (pCVar2->super_CTPNListEleBase).prev_ = (CTPNListEle *)0x0;
  (pCVar2->super_CTPNListEleBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       (_func_int **)&PTR_gen_code_003122a0;
  this->cnt_ = this->cnt_ + 1;
  pCVar3 = (CTPNListBase *)this->tail_;
  (pCVar2->super_CTPNListEleBase).prev_ = (CTPNListEle *)pCVar3;
  if (pCVar3 == (CTPNListBase *)0x0) {
    pCVar3 = this;
  }
  pCVar3->head_ = pCVar2;
  this->tail_ = pCVar2;
  iVar1 = (*(expr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(expr);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    this->field_0x48 = this->field_0x48 & 0xfe;
  }
  return;
}

Assistant:

void CTPNListBase::add_element(CTcPrsNode *expr)
{
    CTPNListEle *ele;
    
    /* create a list element object for the new element */
    ele = new CTPNListEle(expr);

    /* count the new entry */
    ++cnt_;

    /* add the element to our linked list */
    ele->set_prev(tail_);
    if (tail_ != 0)
        tail_->set_next(ele);
    else
        head_ = ele;
    tail_ = ele;

    /* 
     *   if the new element does not have a constant value, the list no
     *   longer has a constant value (if it did before) 
     */
    if (!expr->is_const())
        is_const_ = FALSE;
}